

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Dam_PrintQue(Dam_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint i;
  float fVar4;
  
  puts("Divisor queue: ");
  i = 1;
  while( true ) {
    if (p->vHash->vObjs->nSize / 4 <= (int)i) break;
    iVar1 = Hash_IntObjData0(p->vHash,i);
    iVar2 = Hash_IntObjData1(p->vHash,i);
    printf("Div %7d : ",(ulong)i);
    fVar4 = Vec_FltEntry(p->vCounts,i);
    printf("Weight %9.2f  ",(double)fVar4);
    iVar3 = Abc_LitIsCompl(iVar1);
    iVar1 = Abc_Lit2Var(iVar1);
    printf("F = %c%c ",(ulong)(0x21 - (iVar3 == 0)),(ulong)(iVar1 + 0x60));
    iVar1 = Hash_IntObjData0(p->vHash,i);
    iVar3 = Hash_IntObjData1(p->vHash,i);
    printf("%c ",(ulong)(iVar1 < iVar3 ^ 0x2b));
    iVar1 = Abc_LitIsCompl(iVar2);
    iVar2 = Abc_Lit2Var(iVar2);
    printf("%c%c   ",(ulong)(0x21 - (iVar1 == 0)),(ulong)(iVar2 + 0x60));
    putchar(10);
    i = i + 1;
  }
  return;
}

Assistant:

void Dam_PrintQue( Dam_Man_t * p )
{
    int i;
    printf( "Divisor queue: \n" );
    for ( i = 1; i <= Hash_IntManEntryNum(p->vHash); i++ )
    {
        int iLit0 = Hash_IntObjData0(p->vHash, i);
        int iLit1 = Hash_IntObjData1(p->vHash, i);
        printf( "Div %7d : ",     i );
        printf( "Weight %9.2f  ", Vec_FltEntry(p->vCounts, i) );
        printf( "F = %c%c ",      Abc_LitIsCompl(iLit0) ? '!': ' ', 'a' + Abc_Lit2Var(iLit0)-1 );
        printf( "%c ",            (Hash_IntObjData0(p->vHash, i) < Hash_IntObjData1(p->vHash, i)) ? '*':'+' );
        printf( "%c%c   ",        Abc_LitIsCompl(iLit1) ? '!': ' ', 'a' + Abc_Lit2Var(iLit1)-1 );
        printf( "\n" );
    }
}